

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O2

bnode * dummy_node(uint8_t ksize,uint8_t vsize,uint16_t level)

{
  bnode *pbVar1;
  undefined3 in_register_00000031;
  
  pbVar1 = (bnode *)malloc(0x1010);
  pbVar1->kvsize = 0;
  pbVar1->flag = 0;
  pbVar1->level = 0;
  pbVar1->nentry = 0;
  pbVar1->kvsize = (ushort)ksize << 8 | (ushort)CONCAT31(in_register_00000031,vsize);
  pbVar1->level = level;
  (pbVar1->field_4).data = pbVar1 + 1;
  return pbVar1;
}

Assistant:

struct bnode* dummy_node(uint8_t ksize, uint8_t vsize, uint16_t level)
{
    struct bnode *node;
    node = (struct bnode*)malloc(sizeof(bnode) + FDB_BLOCKSIZE);
    memset(node, 0, sizeof(bnode));

    node->kvsize = ksize<<8 | vsize;
    node->level = level;
    node->data = (uint8_t *)node + sizeof(bnode);
    return node;
}